

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O0

ushort Memory::ValidPointers<SmallAllocationBlockAttributes>::CalculateInteriorAddressIndex
                 (uint index,uint indexPerObject,uint maxObjectIndex)

{
  code *pcVar1;
  bool bVar2;
  undefined8 *in_FS_OFFSET;
  uint addressIndex;
  uint maxObjectIndex_local;
  uint indexPerObject_local;
  uint index_local;
  
  if (0xff < index) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.cpp"
                       ,0x6d,"(index < TBlockAttributes::MaxSmallObjectCount)",
                       "index < TBlockAttributes::MaxSmallObjectCount");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  if (index < maxObjectIndex) {
    if (0xfffe < index / indexPerObject) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.cpp"
                         ,0x73,"(addressIndex < (32767 * 2 + 1))","addressIndex < USHRT_MAX");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
    indexPerObject_local._2_2_ = (ushort)(index / indexPerObject);
  }
  else {
    indexPerObject_local._2_2_ = 0xffff;
  }
  return indexPerObject_local._2_2_;
}

Assistant:

ushort ValidPointers<TBlockAttributes>::CalculateInteriorAddressIndex(uint index, uint indexPerObject, uint maxObjectIndex)
{
    Assert(index < TBlockAttributes::MaxSmallObjectCount);
    if (index >= maxObjectIndex)
    {
        return (ushort)-1;
    }
    uint addressIndex = index / indexPerObject;
    Assert(addressIndex < USHRT_MAX);
    return (ushort)addressIndex;
}